

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_exception.h
# Opt level: O2

void __thiscall rcdiscover::SocketException::~SocketException(SocketException *this)

{
  *(undefined ***)this = &PTR__SocketException_00120ca8;
  std::__cxx11::string::~string((string *)&this->msg_);
  std::runtime_error::~runtime_error(&this->super_runtime_error);
  return;
}

Assistant:

virtual ~SocketException() = default;